

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::emit(Forth *this)

{
  requireDStackDepth(this,1,"EMIT");
  ForthStack<unsigned_int>::getTop(&this->dStack);
  ForthStack<unsigned_int>::pop(&this->dStack);
  if (this->writeToTarget == ToStdCout) {
    std::ostream::put(-8);
    std::ostream::flush();
    return;
  }
  if (this->writeToTarget == ToString) {
    std::ios::clear((int)this + 0x10 + (int)*(undefined8 *)(*(long *)&this->std_cout + -0x18));
    std::ostream::put((char)this + ' ');
    return;
  }
  return;
}

Assistant:

void emit() {
			REQUIRE_DSTACK_DEPTH(1, "EMIT");
			auto cell = dStack.getTop(); pop();
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
			switch (writeToTarget) {
			case ToString:
				std_cout.clear();
				std_cout.put(static_cast<char>(cell));
				break;
			case ToStdCout:
				std::cout.put(static_cast<char>(cell)); std::cout.flush();
				break;
			default:
				break;
			}
#endif
		}